

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__process_child_init
               (uv_process_options_t *options,int *error_fd,int stdio_count,int (*pipes) [2])

{
  undefined4 uVar1;
  int iVar2;
  __sighandler_t p_Var3;
  int *piVar4;
  ulong uVar5;
  size_t __cpu;
  undefined1 local_140 [4];
  int _saved_errno;
  cpu_set_t cpuset;
  int cpumask_size;
  int i;
  int n;
  int fd;
  int use_fd;
  int close_fd;
  sigset_t signewset;
  int (*pipes_local) [2];
  int stdio_count_local;
  int *error_fd_local;
  uv_process_options_t *options_local;
  
  signewset.__val[0xf] = (unsigned_long)pipes;
  for (cpumask_size = 1; cpumask_size < 0x20; cpumask_size = cpumask_size + 1) {
    if (((cpumask_size != 9) && (cpumask_size != 0x13)) &&
       (p_Var3 = signal(cpumask_size,(__sighandler_t)0x0),
       p_Var3 == (__sighandler_t)0xffffffffffffffff)) {
      uv__write_errno(error_fd);
    }
  }
  if ((options->flags & 8) != 0) {
    setsid();
  }
  for (i = 0; i < stdio_count; i = i + 1) {
    iVar2 = *(int *)(signewset.__val[0xf] + 4 + (long)i * 8);
    if ((-1 < iVar2) && (iVar2 < i)) {
      uVar1 = fcntl64(iVar2,0x406,stdio_count);
      *(undefined4 *)(signewset.__val[0xf] + 4 + (long)i * 8) = uVar1;
      if (*(int *)(signewset.__val[0xf] + 4 + (long)i * 8) == -1) {
        uv__write_errno(error_fd);
      }
    }
  }
  i = 0;
  do {
    if (stdio_count <= i) {
      if ((options->cwd != (char *)0x0) && (iVar2 = chdir(options->cwd), iVar2 != 0)) {
        uv__write_errno(error_fd);
      }
      if ((options->flags & 3) != 0) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        setgroups(0,(__gid_t *)0x0);
        piVar4 = __errno_location();
        *piVar4 = iVar2;
      }
      if (((options->flags & 2) != 0) && (iVar2 = setgid(options->gid), iVar2 != 0)) {
        uv__write_errno(error_fd);
      }
      if (((options->flags & 1) != 0) && (iVar2 = setuid(options->uid), iVar2 != 0)) {
        uv__write_errno(error_fd);
      }
      if (options->cpumask != (char *)0x0) {
        cpuset.__bits[0xf]._0_4_ = uv_cpumask_size();
        if (options->cpumask_size < (ulong)(long)(int)cpuset.__bits[0xf]) {
          __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                        ,0x221,
                        "void uv__process_child_init(const uv_process_options_t *, volatile int *, int, int (*)[2])"
                       );
        }
        memset(local_140,0,0x80);
        for (cpuset.__bits[0xf]._4_4_ = 0; cpuset.__bits[0xf]._4_4_ < (int)cpuset.__bits[0xf];
            cpuset.__bits[0xf]._4_4_ = cpuset.__bits[0xf]._4_4_ + 1) {
          if ((options->cpumask[cpuset.__bits[0xf]._4_4_] != '\0') &&
             ((ulong)(long)cpuset.__bits[0xf]._4_4_ >> 3 < 0x80)) {
            uVar5 = (ulong)(long)cpuset.__bits[0xf]._4_4_ >> 6;
            cpuset.__bits[uVar5 - 1] =
                 1L << ((byte)cpuset.__bits[0xf]._4_4_ & 0x3f) | cpuset.__bits[uVar5 - 1];
          }
        }
        iVar2 = sched_setaffinity(0,0x80,(cpu_set_t *)local_140);
        if (iVar2 != 0) {
          uv__write_errno(error_fd);
        }
      }
      sigemptyset((sigset_t *)&use_fd);
      iVar2 = sigprocmask(2,(sigset_t *)&use_fd,(sigset_t *)0x0);
      if (iVar2 == 0) {
        if (options->env == (char **)0x0) {
          execvp(options->file,options->args);
        }
        else {
          uv__execvpe(options->file,options->args,options->env);
        }
        uv__write_errno(error_fd);
        return;
      }
      abort();
    }
    fd = -1;
    n = *(int *)(signewset.__val[0xf] + 4 + (long)i * 8);
    if (n < 0) {
      if (i < 3) {
        uv__close_nocheckstdio(i);
        iVar2 = 2;
        if (i == 0) {
          iVar2 = 0;
        }
        n = open64("/dev/null",iVar2);
        fd = n;
        if (n < 0) {
          uv__write_errno(error_fd);
        }
        goto LAB_00120520;
      }
    }
    else {
LAB_00120520:
      if (i == n) {
        if ((fd == -1) && (iVar2 = uv__cloexec(n,0), iVar2 != 0)) {
          uv__write_int(error_fd,iVar2);
        }
      }
      else {
        i = dup2(n,i);
      }
      if (i == -1) {
        uv__write_errno(error_fd);
      }
      if ((i < 3) && (fd == -1)) {
        uv__nonblock_fcntl(i,0);
      }
      if (stdio_count <= fd) {
        uv__close(fd);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
#ifdef __linux__
                                   volatile int* error_fd,
#else
                                   int error_fd,
#endif
                                   int stdio_count,
                                   int (*pipes)[2]) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;
#if defined(__linux__) || defined(__FreeBSD__)
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

#if defined(__linux__)
    /* Avoid using pthread calls when using vfork. */
    if (sched_setaffinity(0, sizeof(cpuset), &cpuset))
      uv__write_errno(error_fd);
#else
    n = pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (n)
      uv__write_int(error_fd, UV__ERR(n));
#endif
  }
#endif

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __linux__
  if (options->env != NULL) {
    uv__execvpe(options->file, options->args, options->env);
  } else {
    execvp(options->file, options->args);
  }
#else
  if (options->env != NULL) {
    environ = options->env;
  }

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif
#endif

  uv__write_errno(error_fd);
}